

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_pool_2d_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *af,ggml_op_pool op,int k0,int k1,
                 int s0,int s1,float p0,float p1)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,af->ne,(ggml_tensor *)0x0,0);
  if (pgVar1 != (ggml_tensor *)0x0) {
    pgVar1->op_params[0] = op;
    pgVar1->op_params[1] = k0;
    pgVar1->op_params[2] = k1;
    pgVar1->op_params[3] = s0;
    pgVar1->op_params[4] = s1;
    *(ulong *)(pgVar1->op_params + 5) = CONCAT44((int)p1,(int)p0);
    pgVar1->op = GGML_OP_POOL_2D_BACK;
    pgVar1->src[0] = a;
    pgVar1->src[1] = af;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h",
             0x70,"GGML_ASSERT(%s) failed","tensor != NULL");
}

Assistant:

struct ggml_tensor * ggml_pool_2d_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * af,
        enum ggml_op_pool     op,
        int                   k0,
        int                   k1,
        int                   s0,
        int                   s1,
        float                 p0,
        float                 p1) {
    struct ggml_tensor * result;
    result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, af->ne);

    int32_t params[] = { op, k0, k1, s0, s1, p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_2D_BACK;
    result->src[0] = a;
    result->src[1] = af;

    return result;
}